

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall
xatlas::internal::param::Chart::Chart
          (Chart *this,ChartCtorBuffers *buffers,Chart *parent,Mesh *parentMesh,
          ConstArrayView<unsigned_int> faces,Vector2 *texcoords,Mesh *originalMesh,uint32_t meshId,
          uint32_t chartGroupId,uint32_t chartId)

{
  Array<unsigned_int> *this_00;
  Array<unsigned_int> *this_01;
  uint8_t *puVar1;
  Vector3 *pos;
  uint *puVar2;
  float fVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint32_t uVar7;
  Enum EVar8;
  Mesh *pMVar9;
  ulong uVar10;
  char *__function;
  long lVar11;
  uint newCapacity;
  ulong uVar12;
  uint32_t i_1;
  int iVar13;
  long lVar14;
  uint32_t vertex;
  uint local_8c [3];
  Vector3 local_80;
  Mesh **local_70;
  Array<unsigned_int> *local_68;
  ArrayBase *local_60;
  ArrayBase *local_58;
  ulong local_50;
  uint *local_48;
  Mesh *local_40;
  ulong local_38;
  
  local_48 = faces.data;
  (this->m_basis).normal.z = 0.0;
  (this->m_basis).bitangent.y = 0.0;
  (this->m_basis).bitangent.z = 0.0;
  (this->m_basis).normal.x = 0.0;
  (this->m_basis).normal.y = 0.0;
  (this->m_basis).tangent.x = 0.0;
  (this->m_basis).tangent.y = 0.0;
  *(undefined8 *)&(this->m_basis).tangent.z = 0;
  this->m_mesh = (Mesh *)0x0;
  this->m_unifiedMesh = (Mesh *)0x0;
  this->m_unmodifiedUnifiedMesh = (Mesh *)0x0;
  this->m_type = Piecewise;
  this->m_warningFlags = 0;
  this->m_closedHolesCount = 0;
  this->m_fixedTJunctionsCount = 0;
  this_00 = &this->m_faceArray;
  (this->m_faceArray).m_base.buffer = (uint8_t *)0x0;
  (this->m_faceArray).m_base.elementSize = 4;
  (this->m_faceArray).m_base.capacity = 0;
  local_58 = &(this->m_chartToOriginalMap).m_base;
  (this->m_chartToOriginalMap).m_base.buffer = (uint8_t *)0x0;
  (this->m_chartToOriginalMap).m_base.elementSize = 4;
  (this->m_chartToOriginalMap).m_base.size = 0;
  (this->m_chartToOriginalMap).m_base.capacity = 0;
  local_60 = &(this->m_chartToUnifiedMap).m_base;
  (this->m_chartToUnifiedMap).m_base.buffer = (uint8_t *)0x0;
  (this->m_chartToUnifiedMap).m_base.elementSize = 4;
  (this->m_chartToUnifiedMap).m_base.size = 0;
  (this->m_chartToUnifiedMap).m_base.capacity = 0;
  (this->m_quality).boundaryIntersection = false;
  (this->m_quality).authalicMetric = 0.0;
  (this->m_quality).totalGeometricArea = 0.0;
  (this->m_quality).stretchMetric = 0.0;
  (this->m_quality).maxStretchMetric = 0.0;
  (this->m_quality).conformalMetric = 0.0;
  (this->m_quality).totalTriangleCount = 0;
  (this->m_quality).flippedTriangleCount = 0;
  (this->m_quality).zeroAreaTriangleCount = 0;
  (this->m_quality).totalParametricArea = 0.0;
  newCapacity = faces.length;
  this->m_initialFaceCount = newCapacity;
  (this->m_faceArray).m_base.size = newCapacity;
  local_40 = parentMesh;
  if (newCapacity != 0) {
    ArrayBase::setArrayCapacity(&this_00->m_base,newCapacity);
    puVar5 = (this_00->m_base).buffer;
    uVar10 = 0;
    do {
      if ((parent->m_faceArray).m_base.size <= local_48[uVar10]) {
LAB_001b5ad2:
        __function = 
        "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]"
        ;
LAB_001b5afe:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4a8,__function);
      }
      if ((this->m_faceArray).m_base.size <= uVar10) {
LAB_001b5ab3:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,
                      "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]"
                     );
      }
      *(undefined4 *)(puVar5 + uVar10 * 4) =
           *(undefined4 *)((parent->m_faceArray).m_base.buffer + (ulong)local_48[uVar10] * 4);
      uVar10 = uVar10 + 1;
    } while (newCapacity != uVar10);
  }
  pMVar9 = (Mesh *)(*(code *)s_realloc)(0,0x1c0);
  if (pMVar9 != (Mesh *)0x0) {
    uVar7 = (this->m_faceArray).m_base.size;
    Mesh::Mesh(pMVar9,originalMesh->m_epsilon,uVar7 * 3,uVar7,0,0xffffffff);
    local_70 = &this->m_mesh;
    *local_70 = pMVar9;
    pMVar9 = (Mesh *)(*(code *)s_realloc)(0,0x1c0);
    if (pMVar9 != (Mesh *)0x0) {
      uVar7 = (this->m_faceArray).m_base.size;
      Mesh::Mesh(pMVar9,originalMesh->m_epsilon,uVar7 * 3,uVar7,0,0xffffffff);
      this->m_unifiedMesh = pMVar9;
      uVar6 = (originalMesh->m_positions).m_base.size;
      (buffers->chartMeshIndices).m_base.size = uVar6;
      if ((buffers->chartMeshIndices).m_base.capacity < uVar6) {
        ArrayBase::setArrayCapacity((ArrayBase *)buffers,uVar6);
        uVar6 = (buffers->chartMeshIndices).m_base.size;
      }
      if (uVar6 != 0) {
        puVar5 = (buffers->chartMeshIndices).m_base.buffer;
        uVar10 = 0;
        do {
          puVar1 = puVar5 + uVar10 * 4;
          puVar1[0] = 0xff;
          puVar1[1] = 0xff;
          puVar1[2] = 0xff;
          puVar1[3] = 0xff;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (buffers->chartMeshIndices).m_base.size);
      }
      this_01 = &buffers->unifiedMeshIndices;
      uVar6 = (originalMesh->m_positions).m_base.size;
      (buffers->unifiedMeshIndices).m_base.size = uVar6;
      if ((buffers->unifiedMeshIndices).m_base.capacity < uVar6) {
        ArrayBase::setArrayCapacity(&this_01->m_base,uVar6);
        uVar6 = (buffers->unifiedMeshIndices).m_base.size;
      }
      if (uVar6 != 0) {
        puVar5 = (this_01->m_base).buffer;
        uVar10 = 0;
        do {
          puVar1 = puVar5 + uVar10 * 4;
          puVar1[0] = 0xff;
          puVar1[1] = 0xff;
          puVar1[2] = 0xff;
          puVar1[3] = 0xff;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (buffers->unifiedMeshIndices).m_base.size);
      }
      local_68 = this_01;
      if (newCapacity != 0) {
        uVar10 = 0;
        local_38 = (ulong)newCapacity;
        do {
          iVar13 = 0;
          local_50 = uVar10;
          do {
            if ((this->m_faceArray).m_base.size <= uVar10) goto LAB_001b5ab3;
            uVar6 = *(int *)((this_00->m_base).buffer + uVar10 * 4) * 3 + iVar13;
            if ((originalMesh->m_indices).m_base.size <= uVar6) goto LAB_001b5ad2;
            local_8c[0] = *(uint *)((originalMesh->m_indices).m_base.buffer + (ulong)uVar6 * 4);
            uVar7 = Mesh::firstColocal(originalMesh,local_8c[0]);
            uVar6 = local_48[uVar10] * 3 + iVar13;
            if ((local_40->m_indices).m_base.size <= uVar6) goto LAB_001b5ad2;
            if ((buffers->unifiedMeshIndices).m_base.size <= uVar7) goto LAB_001b5ab3;
            uVar6 = *(uint *)((local_40->m_indices).m_base.buffer + (ulong)uVar6 * 4);
            puVar5 = (local_68->m_base).buffer;
            uVar12 = (ulong)uVar7;
            if (*(int *)(puVar5 + uVar12 * 4) == -1) {
              pMVar9 = this->m_unifiedMesh;
              *(uint32_t *)(puVar5 + uVar12 * 4) = (pMVar9->m_positions).m_base.size;
              uVar4 = (originalMesh->m_positions).m_base.size;
              if ((local_8c[0] < uVar4) && (uVar7 < uVar4)) {
                puVar5 = (originalMesh->m_positions).m_base.buffer;
                pos = (Vector3 *)(puVar5 + (ulong)local_8c[0] * 0xc);
                fVar3 = originalMesh->m_epsilon;
                if ((fVar3 < ABS(pos->x - *(float *)(puVar5 + uVar12 * 0xc))) ||
                   ((fVar3 < ABS(pos->y - *(float *)(puVar5 + uVar12 * 0xc + 4)) ||
                    (fVar3 < ABS(pos->z - *(float *)(puVar5 + uVar12 * 0xc + 8)))))) {
                  __assert_fail("equal(originalMesh->position(vertex), originalMesh->position(unifiedVertex), originalMesh->epsilon())"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                                ,0x1a8b,
                                "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                               );
                }
                local_80.x = 0.0;
                local_80.y = 0.0;
                local_80.z = 0.0;
                Mesh::addVertex(pMVar9,pos,&local_80,texcoords + uVar6);
                uVar10 = local_50;
                goto LAB_001b58a9;
              }
LAB_001b5ae9:
              __function = 
              "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
              ;
              goto LAB_001b5afe;
            }
LAB_001b58a9:
            if ((buffers->chartMeshIndices).m_base.size <= local_8c[0]) goto LAB_001b5ab3;
            puVar5 = (buffers->chartMeshIndices).m_base.buffer;
            if (*(int *)(puVar5 + (ulong)local_8c[0] * 4) == -1) {
              *(uint32_t *)(puVar5 + (ulong)local_8c[0] * 4) =
                   ((*local_70)->m_positions).m_base.size;
              ArrayBase::push_back(local_58,(uint8_t *)local_8c);
              if ((buffers->unifiedMeshIndices).m_base.size <= uVar7) goto LAB_001b5ab3;
              ArrayBase::push_back(local_60,(local_68->m_base).buffer + uVar12 * 4);
              if ((originalMesh->m_positions).m_base.size <= local_8c[0]) goto LAB_001b5ae9;
              local_80.x = 0.0;
              local_80.y = 0.0;
              local_80.z = 0.0;
              Mesh::addVertex(*local_70,
                              (Vector3 *)
                              ((originalMesh->m_positions).m_base.buffer + (ulong)local_8c[0] * 0xc)
                              ,&local_80,texcoords + uVar6);
              uVar10 = local_50;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 != 3);
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_38);
        if (newCapacity != 0) {
          uVar6 = 0;
          do {
            lVar14 = 0;
            do {
              if ((this->m_faceArray).m_base.size <= uVar6) goto LAB_001b5ab3;
              uVar10 = (ulong)(uint)(*(int *)((this_00->m_base).buffer + (ulong)uVar6 * 4) * 3) +
                       lVar14;
              if ((originalMesh->m_indices).m_base.size <= (uint)uVar10) goto LAB_001b5ad2;
              uVar4 = *(uint *)((originalMesh->m_indices).m_base.buffer + (uVar10 & 0xffffffff) * 4)
              ;
              if ((buffers->chartMeshIndices).m_base.size <= uVar4) goto LAB_001b5ab3;
              (&local_80.x)[lVar14] =
                   *(float *)((buffers->chartMeshIndices).m_base.buffer + (ulong)uVar4 * 4);
              uVar7 = Mesh::firstColocal(originalMesh,uVar4);
              if ((buffers->unifiedMeshIndices).m_base.size <= uVar7) goto LAB_001b5ab3;
              local_8c[lVar14] = *(uint *)((local_68->m_base).buffer + (ulong)uVar7 * 4);
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            EVar8 = Mesh::addFace(*local_70,(uint32_t *)&local_80,false,true);
            if (EVar8 != OK) {
              __assert_fail("result == Mesh::AddFaceResult::OK",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x1aa0,
                            "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                           );
            }
            lVar14 = 0;
            while (lVar14 != 3) {
              lVar11 = 0;
              if (lVar14 != 2) {
                lVar11 = lVar14 + 1;
              }
              puVar2 = local_8c + lVar14;
              lVar14 = lVar14 + 1;
              if (*puVar2 == local_8c[lVar11]) {
                __assert_fail("index1 != index2",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                              ,0x1aa6,
                              "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                             );
              }
            }
            EVar8 = Mesh::addFace(this->m_unifiedMesh,local_8c,false,true);
            if (EVar8 != OK) {
              __assert_fail("result == Mesh::AddFaceResult::OK",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                            ,0x1aab,
                            "xatlas::internal::param::Chart::Chart(ChartCtorBuffers &, const Chart *, const Mesh *, ConstArrayView<uint32_t>, const Vector2 *, const Mesh *, uint32_t, uint32_t, uint32_t)"
                           );
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != newCapacity);
        }
      }
      Mesh::createBoundaries(*local_70);
      Mesh::createBoundaries(this->m_unifiedMesh);
      Mesh::linkBoundaries(this->m_unifiedMesh);
      return;
    }
  }
  __assert_fail("mem",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x154,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)");
}

Assistant:

Chart(ChartCtorBuffers &buffers, const Chart *parent, const Mesh *parentMesh, ConstArrayView<uint32_t> faces, const Vector2 *texcoords, const Mesh *originalMesh, uint32_t meshId, uint32_t chartGroupId, uint32_t chartId) : m_mesh(nullptr), m_unifiedMesh(nullptr), m_unmodifiedUnifiedMesh(nullptr), m_type(ChartType::Piecewise), m_warningFlags(0), m_closedHolesCount(0), m_fixedTJunctionsCount(0)
	{
		XA_UNUSED(meshId);
		XA_UNUSED(chartGroupId);
		XA_UNUSED(chartId);
		const uint32_t faceCount = m_initialFaceCount = faces.length;
		m_faceArray.resize(faceCount);
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceArray[i] = parent->m_faceArray[faces[i]]; // Map faces to parent chart original mesh.
		// Copy face indices.
		m_mesh = XA_NEW_ARGS(MemTag::Mesh, Mesh, originalMesh->epsilon(), m_faceArray.size() * 3, m_faceArray.size());
		m_unifiedMesh = XA_NEW_ARGS(MemTag::Mesh, Mesh, originalMesh->epsilon(), m_faceArray.size() * 3, m_faceArray.size());
		Array<uint32_t> &chartMeshIndices = buffers.chartMeshIndices;
		chartMeshIndices.resize(originalMesh->vertexCount());
		chartMeshIndices.setAll(UINT32_MAX);
		Array<uint32_t> &unifiedMeshIndices = buffers.unifiedMeshIndices;
		unifiedMeshIndices.resize(originalMesh->vertexCount());
		unifiedMeshIndices.setAll(UINT32_MAX);
		// Add vertices.
		for (uint32_t f = 0; f < faceCount; f++) {
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = originalMesh->vertexAt(m_faceArray[f] * 3 + i);
				const uint32_t unifiedVertex = originalMesh->firstColocal(vertex);
				const uint32_t parentVertex = parentMesh->vertexAt(faces[f] * 3 + i);
				if (unifiedMeshIndices[unifiedVertex] == (uint32_t)~0) {
					unifiedMeshIndices[unifiedVertex] = m_unifiedMesh->vertexCount();
					XA_DEBUG_ASSERT(equal(originalMesh->position(vertex), originalMesh->position(unifiedVertex), originalMesh->epsilon()));
					m_unifiedMesh->addVertex(originalMesh->position(vertex), Vector3(0.0f), texcoords[parentVertex]);
				}
				if (chartMeshIndices[vertex] == (uint32_t)~0) {
					chartMeshIndices[vertex] = m_mesh->vertexCount();
					m_chartToOriginalMap.push_back(vertex);
					m_chartToUnifiedMap.push_back(unifiedMeshIndices[unifiedVertex]);
					m_mesh->addVertex(originalMesh->position(vertex), Vector3(0.0f), texcoords[parentVertex]);
				}
			}
		}
		// Add faces.
		for (uint32_t f = 0; f < faceCount; f++) {
			uint32_t indices[3], unifiedIndices[3];
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = originalMesh->vertexAt(m_faceArray[f] * 3 + i);
				indices[i] = chartMeshIndices[vertex];
				unifiedIndices[i] = unifiedMeshIndices[originalMesh->firstColocal(vertex)];
			}
			Mesh::AddFaceResult::Enum result = m_mesh->addFace(indices);
			XA_UNUSED(result);
			XA_DEBUG_ASSERT(result == Mesh::AddFaceResult::OK);
#if XA_DEBUG
			// Unifying colocals may create degenerate edges. e.g. if two triangle vertices are colocal.
			for (int i = 0; i < 3; i++) {
				const uint32_t index1 = unifiedIndices[i];
				const uint32_t index2 = unifiedIndices[(i + 1) % 3];
				XA_DEBUG_ASSERT(index1 != index2);
			}
#endif
			result = m_unifiedMesh->addFace(unifiedIndices);
			XA_UNUSED(result);
			XA_DEBUG_ASSERT(result == Mesh::AddFaceResult::OK);
		}
		m_mesh->createBoundaries(); // For AtlasPacker::computeBoundingBox
		m_unifiedMesh->createBoundaries();
		m_unifiedMesh->linkBoundaries();
	}